

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

END_HANDLE end_create(void)

{
  AMQP_VALUE pAVar1;
  END_HANDLE local_10;
  END_INSTANCE *end_instance;
  
  local_10 = (END_HANDLE)malloc(8);
  if (local_10 != (END_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x17);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (END_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

END_HANDLE end_create(void)
{
    END_INSTANCE* end_instance = (END_INSTANCE*)malloc(sizeof(END_INSTANCE));
    if (end_instance != NULL)
    {
        end_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(23);
        if (end_instance->composite_value == NULL)
        {
            free(end_instance);
            end_instance = NULL;
        }
    }

    return end_instance;
}